

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell.hpp
# Opt level: O1

size_t __thiscall lattice::unitcell::add_site(unitcell *this,coordinate_t *pos,int tp)

{
  double dVar1;
  size_t sVar2;
  pointer psVar3;
  pointer psVar4;
  invalid_argument *this_00;
  size_t sVar5;
  site_t local_40;
  
  sVar2 = this->dim_;
  if ((pos->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      sVar2) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"site coordinate dimension mismatch");
LAB_00109151:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (sVar2 != 0) {
    sVar5 = 0;
    do {
      dVar1 = (pos->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [sVar5];
      if ((dVar1 < 0.0) || (1.0 <= dVar1)) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"site coordinate out of range");
        goto LAB_00109151;
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  psVar3 = (this->sites_).
           super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->sites_).
           super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_40,
             (DenseStorage<double,__1,__1,_1,_0> *)pos);
  local_40.type = tp;
  std::vector<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>::
  emplace_back<lattice::unitcell::site_t>(&this->sites_,&local_40);
  free(local_40.coordinate.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  return ((long)psVar4 - (long)psVar3 >> 3) * -0x5555555555555555;
}

Assistant:

std::size_t dimension() const { return dim_; }